

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateMergeFromCodedStream
          (MessageGenerator *this,Printer *printer)

{
  char *pcVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  WireType WVar7;
  Type type;
  uint32 uVar8;
  MessageOptions *this_00;
  FieldDescriptor **ppFVar9;
  FieldOptions *pFVar10;
  string *psVar11;
  FileDescriptor *pFVar12;
  int i_00;
  uint i_01;
  uint i_02;
  uint i_03;
  uint i_04;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  uint32 local_140;
  uint local_13c;
  uint32 end_tag;
  uint32 start_tag;
  ExtensionRange *range;
  undefined1 local_128 [4];
  int i_1;
  FieldDescriptor *local_108;
  FieldDescriptor *next_field;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  FieldGenerator *local_90;
  FieldGenerator *field_generator;
  FieldDescriptor *local_68;
  FieldDescriptor *field;
  int i;
  scoped_array<const_google::protobuf::FieldDescriptor_*> ordered_fields;
  allocator<char> local_39;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  this_00 = Descriptor::options(this->descriptor_);
  bVar3 = MessageOptions::message_set_wire_format(this_00);
  if (bVar3) {
    io::Printer::Print(local_18,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n"
                       ,"classname",&this->classname_);
    pFVar12 = Descriptor::file(this->descriptor_);
    pPVar2 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    PrintHandlingOptionalStaticInitializers
              (pFVar12,pPVar2,
               "  return _extensions_.ParseMessageSet(input, default_instance_,\n                                      mutable_unknown_fields());\n"
               ,
               "  return _extensions_.ParseMessageSet(input, &default_instance(),\n                                      mutable_unknown_fields());\n"
               ,"classname",&this->classname_,(char *)0x0,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    io::Printer::Print(local_18,"}\n");
  }
  else {
    io::Printer::Print(local_18,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n#define DO_(EXPRESSION) if (!(EXPRESSION)) return false\n  ::google::protobuf::uint32 tag;\n  while ((tag = input->ReadTag()) != 0) {\n"
                       ,"classname",&this->classname_);
    io::Printer::Indent(local_18);
    io::Printer::Indent(local_18);
    iVar4 = Descriptor::field_count(this->descriptor_);
    if (0 < iVar4) {
      io::Printer::Print(local_18,
                         "switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {\n"
                        );
      io::Printer::Indent(local_18);
      ppFVar9 = anon_unknown_0::SortFieldsByNumber(this->descriptor_);
      internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array
                ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)&stack0xffffffffffffffa8
                 ,ppFVar9);
      for (field._4_4_ = 0; iVar4 = field._4_4_, iVar5 = Descriptor::field_count(this->descriptor_),
          iVar4 < iVar5; field._4_4_ = field._4_4_ + 1) {
        ppFVar9 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                             &stack0xffffffffffffffa8,(long)field._4_4_);
        local_68 = *ppFVar9;
        anon_unknown_0::PrintFieldComment(local_18,local_68);
        pPVar2 = local_18;
        uVar6 = FieldDescriptor::number(local_68);
        SimpleItoa_abi_cxx11_((string *)&field_generator,(protobuf *)(ulong)uVar6,i_00);
        io::Printer::Print(pPVar2,"case $number$: {\n","number",(string *)&field_generator);
        std::__cxx11::string::~string((string *)&field_generator);
        io::Printer::Indent(local_18);
        local_90 = FieldGeneratorMap::get(&this->field_generators_,local_68);
        pPVar2 = local_18;
        WVar7 = internal::WireFormat::WireTypeForField(local_68);
        pcVar1 = *(char **)((anonymous_namespace)::kWireTypeNames + (ulong)WVar7 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar1,&local_b1);
        io::Printer::Print(pPVar2,
                           "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_$wiretype$) {\n"
                           ,"wiretype",&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
        if (field._4_4_ < 1) {
          bVar3 = FieldDescriptor::is_repeated(local_68);
          if (bVar3) {
            pFVar10 = FieldDescriptor::options(local_68);
            bVar3 = FieldOptions::packed(pFVar10);
            if (!bVar3) goto LAB_002a6b6d;
          }
        }
        else {
LAB_002a6b6d:
          pPVar2 = local_18;
          psVar11 = FieldDescriptor::name_abi_cxx11_(local_68);
          io::Printer::Print(pPVar2," parse_$name$:\n","name",psVar11);
        }
        io::Printer::Indent(local_18);
        pFVar10 = FieldDescriptor::options(local_68);
        bVar3 = FieldOptions::packed(pFVar10);
        if (bVar3) {
          (*local_90->_vptr_FieldGenerator[0xe])(local_90,local_18);
        }
        else {
          (*local_90->_vptr_FieldGenerator[0xd])(local_90,local_18);
        }
        io::Printer::Outdent(local_18);
        bVar3 = FieldDescriptor::is_packable(local_68);
        if (bVar3) {
          pFVar10 = FieldDescriptor::options(local_68);
          bVar3 = FieldOptions::packed(pFVar10);
          pPVar2 = local_18;
          if (!bVar3) goto LAB_002a6dfb;
          type = FieldDescriptor::type(local_68);
          WVar7 = internal::WireFormat::WireTypeForFieldType(type);
          pcVar1 = *(char **)((anonymous_namespace)::kWireTypeNames + (ulong)WVar7 * 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar1,&local_d9);
          io::Printer::Print(pPVar2,
                             "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n           == ::google::protobuf::internal::WireFormatLite::\n              WIRETYPE_$wiretype$) {\n"
                             ,"wiretype",&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_d9);
          io::Printer::Indent(local_18);
          (*local_90->_vptr_FieldGenerator[0xd])(local_90,local_18);
          io::Printer::Outdent(local_18);
        }
        else {
LAB_002a6dfb:
          bVar3 = FieldDescriptor::is_packable(local_68);
          if (bVar3) {
            pFVar10 = FieldDescriptor::options(local_68);
            bVar3 = FieldOptions::packed(pFVar10);
            if (!bVar3) {
              io::Printer::Print(local_18,
                                 "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n           == ::google::protobuf::internal::WireFormatLite::\n              WIRETYPE_LENGTH_DELIMITED) {\n"
                                );
              io::Printer::Indent(local_18);
              (*local_90->_vptr_FieldGenerator[0xe])(local_90,local_18);
              io::Printer::Outdent(local_18);
            }
          }
        }
        io::Printer::Print(local_18,"} else {\n  goto handle_uninterpreted;\n}\n");
        bVar3 = FieldDescriptor::is_repeated(local_68);
        if (bVar3) {
          pFVar10 = FieldDescriptor::options(local_68);
          bVar3 = FieldOptions::packed(pFVar10);
          pPVar2 = local_18;
          if (!bVar3) {
            uVar8 = internal::WireFormat::MakeTag(local_68);
            SimpleItoa_abi_cxx11_((string *)&next_field,(protobuf *)(ulong)uVar8,i_01);
            psVar11 = FieldDescriptor::name_abi_cxx11_(local_68);
            io::Printer::Print(pPVar2,"if (input->ExpectTag($tag$)) goto parse_$name$;\n","tag",
                               (string *)&next_field,"name",psVar11);
            std::__cxx11::string::~string((string *)&next_field);
          }
        }
        iVar5 = field._4_4_ + 1;
        iVar4 = Descriptor::field_count(this->descriptor_);
        if (iVar5 < iVar4) {
          ppFVar9 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)
                               &stack0xffffffffffffffa8,(long)(field._4_4_ + 1));
          pPVar2 = local_18;
          local_108 = *ppFVar9;
          uVar8 = internal::WireFormat::MakeTag(local_108);
          SimpleItoa_abi_cxx11_((string *)local_128,(protobuf *)(ulong)uVar8,i_02);
          psVar11 = FieldDescriptor::name_abi_cxx11_(local_108);
          io::Printer::Print(pPVar2,"if (input->ExpectTag($next_tag$)) goto parse_$next_name$;\n",
                             "next_tag",(string *)local_128,"next_name",psVar11);
          std::__cxx11::string::~string((string *)local_128);
        }
        else {
          io::Printer::Print(local_18,"if (input->ExpectAtEnd()) return true;\n");
        }
        io::Printer::Print(local_18,"break;\n");
        io::Printer::Outdent(local_18);
        io::Printer::Print(local_18,"}\n\n");
      }
      io::Printer::Print(local_18,"default: {\nhandle_uninterpreted:\n");
      io::Printer::Indent(local_18);
      internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
                ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)&stack0xffffffffffffffa8
                );
    }
    io::Printer::Print(local_18,
                       "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n  return true;\n}\n"
                      );
    iVar4 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar4) {
      io::Printer::Print(local_18,"if (");
      for (range._4_4_ = 0; iVar4 = range._4_4_,
          iVar5 = Descriptor::extension_range_count(this->descriptor_), iVar4 < iVar5;
          range._4_4_ = range._4_4_ + 1) {
        _end_tag = Descriptor::extension_range(this->descriptor_,range._4_4_);
        if (0 < range._4_4_) {
          io::Printer::Print(local_18," ||\n    ");
        }
        local_13c = internal::WireFormatLite::MakeTag(_end_tag->start,WIRETYPE_VARINT);
        local_140 = internal::WireFormatLite::MakeTag(_end_tag->end,WIRETYPE_VARINT);
        pPVar2 = local_18;
        if (_end_tag->end < 0x20000000) {
          SimpleItoa_abi_cxx11_(&local_180,(protobuf *)(ulong)local_13c,i_03);
          SimpleItoa_abi_cxx11_(&local_1a0,(protobuf *)(ulong)local_140,i_04);
          io::Printer::Print(pPVar2,"($start$u <= tag && tag < $end$u)","start",&local_180,"end",
                             &local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_180);
        }
        else {
          SimpleItoa_abi_cxx11_(&local_160,(protobuf *)(ulong)local_13c,i_03);
          io::Printer::Print(pPVar2,"($start$u <= tag)","start",&local_160);
          std::__cxx11::string::~string((string *)&local_160);
        }
      }
      io::Printer::Print(local_18,") {\n");
      pFVar12 = Descriptor::file(this->descriptor_);
      bVar3 = HasUnknownFields(pFVar12);
      if (bVar3) {
        pFVar12 = Descriptor::file(this->descriptor_);
        pPVar2 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
        PrintHandlingOptionalStaticInitializers
                  (pFVar12,pPVar2,
                   "  DO_(_extensions_.ParseField(tag, input, default_instance_,\n                              mutable_unknown_fields()));\n"
                   ,
                   "  DO_(_extensions_.ParseField(tag, input, &default_instance(),\n                              mutable_unknown_fields()));\n"
                   ,(char *)0x0,&local_1c0,(char *)0x0,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator(&local_1c1);
      }
      else {
        pFVar12 = Descriptor::file(this->descriptor_);
        pPVar2 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"",&local_211);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"",&local_239);
        PrintHandlingOptionalStaticInitializers
                  (pFVar12,pPVar2,"  DO_(_extensions_.ParseField(tag, input, default_instance_));\n"
                   ,"  DO_(_extensions_.ParseField(tag, input, &default_instance()));\n",(char *)0x0
                   ,&local_210,(char *)0x0,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator(&local_239);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator(&local_211);
      }
      io::Printer::Print(local_18,"  continue;\n}\n");
    }
    pFVar12 = Descriptor::file(this->descriptor_);
    bVar3 = HasUnknownFields(pFVar12);
    if (bVar3) {
      io::Printer::Print(local_18,
                         "DO_(::google::protobuf::internal::WireFormat::SkipField(\n      input, tag, mutable_unknown_fields()));\n"
                        );
    }
    else {
      io::Printer::Print(local_18,
                         "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n"
                        );
    }
    iVar4 = Descriptor::field_count(this->descriptor_);
    if (0 < iVar4) {
      io::Printer::Print(local_18,"break;\n");
      io::Printer::Outdent(local_18);
      io::Printer::Print(local_18,"}\n");
      io::Printer::Outdent(local_18);
      io::Printer::Print(local_18,"}\n");
    }
    io::Printer::Outdent(local_18);
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"  }\n  return true;\n#undef DO_\n}\n");
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "bool $classname$::MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input) {\n",
      "classname", classname_);

    PrintHandlingOptionalStaticInitializers(
      descriptor_->file(), printer,
      // With static initializers.
      "  return _extensions_.ParseMessageSet(input, default_instance_,\n"
      "                                      mutable_unknown_fields());\n",
      // Without.
      "  return _extensions_.ParseMessageSet(input, &default_instance(),\n"
      "                                      mutable_unknown_fields());\n",
      // Vars.
      "classname", classname_);

    printer->Print(
      "}\n");
    return;
  }

  printer->Print(
    "bool $classname$::MergePartialFromCodedStream(\n"
    "    ::google::protobuf::io::CodedInputStream* input) {\n"
    "#define DO_(EXPRESSION) if (!(EXPRESSION)) return false\n"
    "  ::google::protobuf::uint32 tag;\n"
    "  while ((tag = input->ReadTag()) != 0) {\n",
    "classname", classname_);

  printer->Indent();
  printer->Indent();

  if (descriptor_->field_count() > 0) {
    // We don't even want to print the switch() if we have no fields because
    // MSVC dislikes switch() statements that contain only a default value.

    // Note:  If we just switched on the tag rather than the field number, we
    // could avoid the need for the if() to check the wire type at the beginning
    // of each case.  However, this is actually a bit slower in practice as it
    // creates a jump table that is 8x larger and sparser, and meanwhile the
    // if()s are highly predictable.
    printer->Print(
      "switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {\n");

    printer->Indent();

    scoped_array<const FieldDescriptor*> ordered_fields(
      SortFieldsByNumber(descriptor_));

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = ordered_fields[i];

      PrintFieldComment(printer, field);

      printer->Print(
        "case $number$: {\n",
        "number", SimpleItoa(field->number()));
      printer->Indent();
      const FieldGenerator& field_generator = field_generators_.get(field);

      // Emit code to parse the common, expected case.
      printer->Print(
        "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n"
        "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_$wiretype$) {\n",
        "wiretype", kWireTypeNames[WireFormat::WireTypeForField(field)]);

      if (i > 0 || (field->is_repeated() && !field->options().packed())) {
        printer->Print(
          " parse_$name$:\n",
          "name", field->name());
      }

      printer->Indent();
      if (field->options().packed()) {
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
      } else {
        field_generator.GenerateMergeFromCodedStream(printer);
      }
      printer->Outdent();

      // Emit code to parse unexpectedly packed or unpacked values.
      if (field->is_packable() && field->options().packed()) {
        printer->Print(
          "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n"
          "           == ::google::protobuf::internal::WireFormatLite::\n"
          "              WIRETYPE_$wiretype$) {\n",
          "wiretype",
          kWireTypeNames[WireFormat::WireTypeForFieldType(field->type())]);
        printer->Indent();
        field_generator.GenerateMergeFromCodedStream(printer);
        printer->Outdent();
      } else if (field->is_packable() && !field->options().packed()) {
        printer->Print(
          "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n"
          "           == ::google::protobuf::internal::WireFormatLite::\n"
          "              WIRETYPE_LENGTH_DELIMITED) {\n");
        printer->Indent();
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
        printer->Outdent();
      }

      printer->Print(
        "} else {\n"
        "  goto handle_uninterpreted;\n"
        "}\n");

      // switch() is slow since it can't be predicted well.  Insert some if()s
      // here that attempt to predict the next tag.
      if (field->is_repeated() && !field->options().packed()) {
        // Expect repeats of this field.
        printer->Print(
          "if (input->ExpectTag($tag$)) goto parse_$name$;\n",
          "tag", SimpleItoa(WireFormat::MakeTag(field)),
          "name", field->name());
      }

      if (i + 1 < descriptor_->field_count()) {
        // Expect the next field in order.
        const FieldDescriptor* next_field = ordered_fields[i + 1];
        printer->Print(
          "if (input->ExpectTag($next_tag$)) goto parse_$next_name$;\n",
          "next_tag", SimpleItoa(WireFormat::MakeTag(next_field)),
          "next_name", next_field->name());
      } else {
        // Expect EOF.
        // TODO(kenton):  Expect group end-tag?
        printer->Print(
          "if (input->ExpectAtEnd()) return true;\n");
      }

      printer->Print(
        "break;\n");

      printer->Outdent();
      printer->Print("}\n\n");
    }

    printer->Print(
      "default: {\n"
      "handle_uninterpreted:\n");
    printer->Indent();
  }

  // Is this an end-group tag?  If so, this must be the end of the message.
  printer->Print(
    "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n"
    "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n"
    "  return true;\n"
    "}\n");

  // Handle extension ranges.
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (");
    for (int i = 0; i < descriptor_->extension_range_count(); i++) {
      const Descriptor::ExtensionRange* range =
        descriptor_->extension_range(i);
      if (i > 0) printer->Print(" ||\n    ");

      uint32 start_tag = WireFormatLite::MakeTag(
        range->start, static_cast<WireFormatLite::WireType>(0));
      uint32 end_tag = WireFormatLite::MakeTag(
        range->end, static_cast<WireFormatLite::WireType>(0));

      if (range->end > FieldDescriptor::kMaxNumber) {
        printer->Print(
          "($start$u <= tag)",
          "start", SimpleItoa(start_tag));
      } else {
        printer->Print(
          "($start$u <= tag && tag < $end$u)",
          "start", SimpleItoa(start_tag),
          "end", SimpleItoa(end_tag));
      }
    }
    printer->Print(") {\n");
    if (HasUnknownFields(descriptor_->file())) {
      PrintHandlingOptionalStaticInitializers(
        descriptor_->file(), printer,
        // With static initializers.
        "  DO_(_extensions_.ParseField(tag, input, default_instance_,\n"
        "                              mutable_unknown_fields()));\n",
        // Without.
        "  DO_(_extensions_.ParseField(tag, input, &default_instance(),\n"
        "                              mutable_unknown_fields()));\n");
    } else {
      PrintHandlingOptionalStaticInitializers(
        descriptor_->file(), printer,
        // With static initializers.
        "  DO_(_extensions_.ParseField(tag, input, default_instance_));\n",
        // Without.
        "  DO_(_extensions_.ParseField(tag, input, &default_instance()));\n");
    }
    printer->Print(
      "  continue;\n"
      "}\n");
  }

  // We really don't recognize this tag.  Skip it.
  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "DO_(::google::protobuf::internal::WireFormat::SkipField(\n"
      "      input, tag, mutable_unknown_fields()));\n");
  } else {
    printer->Print(
      "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n");
  }

  if (descriptor_->field_count() > 0) {
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");    // default:
    printer->Outdent();
    printer->Print("}\n");    // switch
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "  }\n"                   // while
    "  return true;\n"
    "#undef DO_\n"
    "}\n");
}